

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.c
# Opt level: O0

cgltf_result
cgltf_load_buffer_base64(cgltf_options *options,cgltf_size size,char *base64,void **out_data)

{
  char cVar1;
  void *pvVar2;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  _func_void_void_ptr_void_ptr *local_70;
  _func_void_ptr_void_ptr_cgltf_size *local_68;
  int index;
  char ch;
  cgltf_size i;
  uint buffer_bits;
  uint buffer;
  uchar *data;
  _func_void_void_ptr_void_ptr *memory_free;
  _func_void_ptr_void_ptr_cgltf_size *memory_alloc;
  void **out_data_local;
  char *base64_local;
  cgltf_size size_local;
  cgltf_options *options_local;
  
  if (options->memory_alloc == (_func_void_ptr_void_ptr_cgltf_size *)0x0) {
    local_68 = cgltf_default_alloc;
  }
  else {
    local_68 = options->memory_alloc;
  }
  if (options->memory_free == (_func_void_void_ptr_void_ptr *)0x0) {
    local_70 = cgltf_default_free;
  }
  else {
    local_70 = options->memory_free;
  }
  pvVar2 = (*local_68)(options->memory_user_data,size);
  if (pvVar2 == (void *)0x0) {
    options_local._4_4_ = cgltf_result_out_of_memory;
  }
  else {
    i._4_4_ = 0;
    i._0_4_ = 0;
    out_data_local = (void **)base64;
    for (_index = 0; _index < size; _index = _index + 1) {
      for (; (uint)i < 8; i._0_4_ = (uint)i + 6) {
        cVar1 = *(char *)out_data_local;
        if ((int)cVar1 - 0x41U < 0x1a) {
          local_74 = (int)cVar1 - 0x41;
        }
        else {
          if ((int)cVar1 - 0x61U < 0x1a) {
            local_78 = (int)cVar1 - 0x47;
          }
          else {
            if ((int)cVar1 - 0x30U < 10) {
              local_7c = (int)cVar1 + 4;
            }
            else {
              if (cVar1 == '+') {
                local_80 = 0x3e;
              }
              else {
                local_80 = 0xffffffff;
                if (cVar1 == '/') {
                  local_80 = 0x3f;
                }
              }
              local_7c = local_80;
            }
            local_78 = local_7c;
          }
          local_74 = local_78;
        }
        if ((int)local_74 < 0) {
          (*local_70)(options->memory_user_data,pvVar2);
          return cgltf_result_io_error;
        }
        i._4_4_ = i._4_4_ << 6 | local_74;
        out_data_local = (void **)((long)out_data_local + 1);
      }
      *(char *)((long)pvVar2 + _index) = (char)(i._4_4_ >> ((char)(uint)i - 8U & 0x1f));
      i._0_4_ = (uint)i - 8;
    }
    *out_data = pvVar2;
    options_local._4_4_ = cgltf_result_success;
  }
  return options_local._4_4_;
}

Assistant:

cgltf_result cgltf_load_buffer_base64(const cgltf_options* options, cgltf_size size, const char* base64, void** out_data)
{
    void* (*memory_alloc)(void*, cgltf_size) = options->memory_alloc ? options->memory_alloc : &cgltf_default_alloc;
    void (*memory_free)(void*, void*) = options->memory_free ? options->memory_free : &cgltf_default_free;

    unsigned char* data = (unsigned char*)memory_alloc(options->memory_user_data, size);
    if (!data)
    {
        return cgltf_result_out_of_memory;
    }

    unsigned int buffer = 0;
    unsigned int buffer_bits = 0;

    for (cgltf_size i = 0; i < size; ++i)
    {
        while (buffer_bits < 8)
        {
            char ch = *base64++;

            int index =
                (unsigned)(ch - 'A') < 26 ? (ch - 'A') :
                (unsigned)(ch - 'a') < 26 ? (ch - 'a') + 26 :
                (unsigned)(ch - '0') < 10 ? (ch - '0') + 52 :
                ch == '+' ? 62 :
                ch == '/' ? 63 :
                -1;

            if (index < 0)
            {
                memory_free(options->memory_user_data, data);
                return cgltf_result_io_error;
            }

            buffer = (buffer << 6) | index;
            buffer_bits += 6;
        }

        data[i] = (unsigned char)(buffer >> (buffer_bits - 8));
        buffer_bits -= 8;
    }

    *out_data = data;

    return cgltf_result_success;
}